

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_get_key_range(btree *btree,idx_t num,idx_t den,void *key_begin,void *key_end)

{
  uint16_t uVar1;
  ushort uVar2;
  btree_print_func *pbVar3;
  void *pvVar4;
  _func_voidref_void_ptr_bid_t *p_Var5;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var6;
  _func_bid_t_void_ptr *p_Var7;
  idx_t iVar8;
  bnode *pbVar9;
  voidref pvVar10;
  bnode *pbVar11;
  bid_t bVar12;
  uint uVar13;
  undefined6 in_register_00000012;
  idx_t iVar14;
  undefined6 in_register_00000032;
  btree_kv_ops *pbVar15;
  void *pvVar16;
  int iVar17;
  void *pvVar18;
  btree_result bVar19;
  ulong uVar20;
  ulong uStack_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  bnode *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  uVar20 = CONCAT62(in_register_00000012,den) & 0xffffffff;
  pvVar18 = (void *)((long)&local_68 - (ulong)(btree->ksize + 0xf & 0xfffffff0));
  pvVar16 = (void *)((long)pvVar18 - (ulong)(btree->vsize + 0xf & 0xfffffff0));
  if (num < (ushort)uVar20) {
    pbVar3 = btree->kv_ops->init_kv_var;
    local_48 = key_end;
    local_40 = key_begin;
    if (pbVar3 != (btree_print_func *)0x0) {
      *(undefined8 *)((long)pvVar16 + -8) = 0x1082da;
      (*pbVar3)(btree,pvVar18,pvVar16);
    }
    bVar12 = btree->root_bid;
    pvVar4 = btree->blk_handle;
    p_Var5 = btree->blk_ops->blk_read;
    local_38 = pvVar18;
    *(undefined8 *)((long)pvVar16 + -8) = 0x1082ed;
    pvVar10 = (*p_Var5)(pvVar4,bVar12);
    uVar1 = btree->height;
    *(undefined8 *)((long)pvVar16 + -8) = 0x1082fc;
    pbVar11 = _fetch_bnode(btree,pvVar10,uVar1);
    pvVar4 = local_38;
    pvVar18 = local_40;
    uVar2 = pbVar11->nentry;
    if (btree->height == 1) {
      iVar17 = (int)CONCAT62(in_register_00000032,num);
      p_Var6 = btree->kv_ops->get_kv;
      *(undefined8 *)((long)pvVar16 + -8) = 0x108331;
      (*p_Var6)(pbVar11,(idx_t)(((uint)uVar2 * iVar17) / uVar20),pvVar18,(void *)0x0);
      pbVar15 = btree->kv_ops;
      iVar14 = (short)((ulong)((uint)pbVar11->nentry * (iVar17 + 1)) /
                      (CONCAT62(in_register_00000012,den) & 0xffffffff)) - 1;
    }
    else {
      local_58 = ((ulong)uVar2 * 0x10 * (ulong)num * 0x10) / ((ulong)den << 4);
      local_68 = (((ulong)num * 0x10 + 0x10) * (ulong)uVar2 * 0x10) / ((ulong)den << 4) - 1;
      local_60 = local_58 >> 4;
      iVar14 = uVar2 - 1;
      if (((uint)(local_68 >> 4) & 0xffff) < (uint)uVar2) {
        iVar14 = (idx_t)(local_68 >> 4);
      }
      iVar8 = (idx_t)local_60;
      p_Var6 = btree->kv_ops->get_kv;
      local_50 = pbVar11;
      *(undefined8 *)((long)pvVar16 + -8) = 0x1083dc;
      (*p_Var6)(pbVar11,iVar8,pvVar4,pvVar16);
      p_Var7 = btree->kv_ops->value2bid;
      *(undefined8 *)((long)pvVar16 + -8) = 0x1083e6;
      bVar12 = (*p_Var7)(pvVar16);
      pvVar18 = btree->blk_handle;
      p_Var5 = btree->blk_ops->blk_read;
      *(undefined8 *)((long)pvVar16 + -8) = 0x1083f7;
      pvVar10 = (*p_Var5)(pvVar18,bVar12 >> 0x38 | (bVar12 & 0xff000000000000) >> 0x28 |
                                  (bVar12 & 0xff0000000000) >> 0x18 | (bVar12 & 0xff00000000) >> 8 |
                                  (bVar12 & 0xff000000) << 8 | (bVar12 & 0xff0000) << 0x18 |
                                  (bVar12 & 0xff00) << 0x28 | bVar12 << 0x38);
      uVar1 = btree->height;
      *(undefined8 *)((long)pvVar16 + -8) = 0x10840b;
      pbVar11 = _fetch_bnode(btree,pvVar10,uVar1 - 1);
      uVar13 = (uint)local_58;
      uVar2 = pbVar11->nentry;
      *(undefined8 *)((long)pvVar16 + -8) = 0xf;
      pvVar18 = local_40;
      uVar20 = *(ulong *)((long)pvVar16 + -8);
      p_Var6 = btree->kv_ops->get_kv;
      *(undefined8 *)((long)pvVar16 + -8) = 0x10843e;
      (*p_Var6)(pbVar11,(idx_t)((((ulong)uVar2 - 1) * (ulong)(uVar13 & 0xf)) / uVar20),pvVar18,
                (void *)0x0);
      pvVar18 = local_38;
      pbVar9 = local_50;
      if (iVar14 != (idx_t)local_60) {
        p_Var6 = btree->kv_ops->get_kv;
        *(undefined8 *)((long)pvVar16 + -8) = 0x10845a;
        (*p_Var6)(pbVar9,iVar14,pvVar18,pvVar16);
        p_Var7 = btree->kv_ops->value2bid;
        *(undefined8 *)((long)pvVar16 + -8) = 0x108464;
        bVar12 = (*p_Var7)(pvVar16);
        pvVar18 = btree->blk_handle;
        p_Var5 = btree->blk_ops->blk_read;
        *(undefined8 *)((long)pvVar16 + -8) = 0x108475;
        pvVar10 = (*p_Var5)(pvVar18,bVar12 >> 0x38 | (bVar12 & 0xff000000000000) >> 0x28 |
                                    (bVar12 & 0xff0000000000) >> 0x18 | (bVar12 & 0xff00000000) >> 8
                                    | (bVar12 & 0xff000000) << 8 | (bVar12 & 0xff0000) << 0x18 |
                                    (bVar12 & 0xff00) << 0x28 | bVar12 << 0x38);
        uVar1 = btree->height;
        *(undefined8 *)((long)pvVar16 + -8) = 0x108489;
        pbVar11 = _fetch_bnode(btree,pvVar10,uVar1 - 1);
      }
      uVar13 = (uint)local_68;
      uVar2 = pbVar11->nentry;
      *(undefined8 *)((long)pvVar16 + -8) = 0xf;
      pbVar15 = btree->kv_ops;
      iVar14 = (idx_t)((((ulong)uVar2 - 1) * (ulong)(uVar13 & 0xf)) / *(ulong *)((long)pvVar16 + -8)
                      );
    }
    pvVar18 = local_48;
    p_Var6 = pbVar15->get_kv;
    *(undefined8 *)((long)pvVar16 + -8) = 0x1084ba;
    (*p_Var6)(pbVar11,iVar14,pvVar18,(void *)0x0);
    pvVar18 = local_38;
    pbVar3 = btree->kv_ops->free_kv_var;
    bVar19 = BTREE_RESULT_SUCCESS;
    if (pbVar3 != (btree_print_func *)0x0) {
      *(undefined8 *)((long)pvVar16 + -8) = 0x1084d6;
      (*pbVar3)(btree,pvVar18,pvVar16);
    }
  }
  else {
    *(undefined8 *)((long)pvVar16 + -8) = 2;
    bVar19 = (btree_result)*(undefined8 *)((long)pvVar16 + -8);
  }
  return bVar19;
}

Assistant:

btree_result btree_get_key_range(
    struct btree *btree, idx_t num, idx_t den, void *key_begin, void *key_end)
{
    void *addr;
    uint8_t *k = alca(uint8_t, btree->ksize);
    uint8_t *v = alca(uint8_t, btree->vsize);
    idx_t idx_begin, idx_end, idx;
    bid_t bid;
    struct bnode *root, *node;
    uint64_t _num, _den, _nentry, resolution, mask, _idx_begin, _idx_end;

    if (num >= den) {
        // TODO: Need to log the corresponding error message
        return BTREE_RESULT_FAIL;
    }
    resolution = 1<<4; mask = resolution-1;

    if (btree->kv_ops->init_kv_var) btree->kv_ops->init_kv_var(btree, k, v);
    _num = (uint64_t)num * resolution;
    _den = (uint64_t)den * resolution;

    // get root node
    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    root = _fetch_bnode(btree, addr, btree->height);
    _nentry = (uint64_t)root->nentry * resolution;

    if (btree->height == 1) {
        btree->kv_ops->get_kv(root, ((num+0) * root->nentry / den)-0, key_begin, NULL);
        btree->kv_ops->get_kv(root, ((num+1) * root->nentry / den)-1, key_end, NULL);
    }else{
        _idx_begin = (_num * _nentry / _den);
        _idx_end = ((_num+resolution) * _nentry / _den)-1;

        idx_begin = _idx_begin / resolution;
        idx_end = (_idx_end / resolution);
        if (idx_end >= root->nentry) idx_end = root->nentry-1;

        // get first child node (for KEY_BEGIN)
        btree->kv_ops->get_kv(root, idx_begin, k, v);
        bid = btree->kv_ops->value2bid(v);
        bid = _endian_decode(bid);
        addr = btree->blk_ops->blk_read(btree->blk_handle, bid);
        node = _fetch_bnode(btree, addr, btree->height-1);

        idx = ((_idx_begin & mask) * (node->nentry-1) / (resolution-1));
        btree->kv_ops->get_kv(node, idx, key_begin, NULL);

        // get second child node (for KEY_END)
        if (idx_end != idx_begin) {
            btree->kv_ops->get_kv(root, idx_end, k, v);
            bid = btree->kv_ops->value2bid(v);
            bid = _endian_decode(bid);
            addr = btree->blk_ops->blk_read(btree->blk_handle, bid);
            node = _fetch_bnode(btree, addr, btree->height-1);
        }

        idx = ((_idx_end & mask) * (node->nentry-1) / (resolution-1));
        btree->kv_ops->get_kv(node, idx, key_end, NULL);
    }

    if (btree->kv_ops->free_kv_var) btree->kv_ops->free_kv_var(btree, k, v);
    return BTREE_RESULT_SUCCESS;
}